

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor.cpp
# Opt level: O2

void __thiscall C_A_T_C_H_T_E_S_T_2::visitor::operator()(visitor *this,float a,int b)

{
  int b_local;
  SourceLineInfo local_e0;
  float local_d0;
  float a_local;
  BinaryExpr<const_float_&,_const_float_&> local_c8;
  AssertionHandler catchAssertionHandler;
  StringRef local_50;
  StringRef local_40;
  
  local_c8.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x1c48db;
  local_c8.super_ITransientExpression.m_isBinaryExpression = true;
  local_c8.super_ITransientExpression.m_result = false;
  local_c8.super_ITransientExpression._10_6_ = 0;
  local_e0.file =
       "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/visitor.cpp";
  local_e0.line = 0xaa;
  b_local = b;
  a_local = a;
  Catch::StringRef::StringRef(&local_40,"a == 3.14f");
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,(StringRef *)&local_c8,&local_e0,local_40,Normal);
  local_d0 = 3.14;
  local_e0.file = (char *)&a_local;
  Catch::ExprLhs<float_const&>::operator==(&local_c8,(ExprLhs<float_const&> *)&local_e0,&local_d0);
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_c8.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_c8.super_ITransientExpression);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_c8.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x1c48db;
  local_c8.super_ITransientExpression.m_isBinaryExpression = true;
  local_c8.super_ITransientExpression.m_result = false;
  local_c8.super_ITransientExpression._10_6_ = 0;
  local_e0.file =
       "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/visitor.cpp";
  local_e0.line = 0xab;
  Catch::StringRef::StringRef(&local_50,"b == value");
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,(StringRef *)&local_c8,&local_e0,local_50,Normal);
  local_e0.file = (char *)&b_local;
  Catch::ExprLhs<int_const&>::operator==
            ((BinaryExpr<const_int_&,_const_int_&> *)&local_c8,(ExprLhs<int_const&> *)&local_e0,
             &this->value);
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_c8.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_c8.super_ITransientExpression);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  return;
}

Assistant:

void operator()(float a, int b)
            {
                REQUIRE(a == 3.14f);
                REQUIRE(b == value);
            }